

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_agents.c
# Opt level: O0

REF_STATUS ref_agents_restart(REF_AGENTS ref_agents,REF_INT part,REF_INT seed,REF_INT id)

{
  REF_INT id_local;
  REF_INT seed_local;
  REF_INT part_local;
  REF_AGENTS ref_agents_local;
  
  ref_agents->agent[id].mode = REF_AGENT_WALKING;
  ref_agents->agent[id].part = part;
  ref_agents->agent[id].seed = seed;
  ref_agents->agent[id].global = -1;
  ref_agents->agent[id].step = 0;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_agents_restart(REF_AGENTS ref_agents, REF_INT part,
                                      REF_INT seed, REF_INT id) {
  ref_agent_mode(ref_agents, id) = REF_AGENT_WALKING;
  ref_agent_part(ref_agents, id) = part;
  ref_agent_seed(ref_agents, id) = seed;
  ref_agent_global(ref_agents, id) = REF_EMPTY;
  ref_agent_step(ref_agents, id) = 0;

  return REF_SUCCESS;
}